

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O2

int __thiscall
CVmObjVector::getp_get_unique(CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  ushort uVar1;
  CVmObjPageEntry *pCVar2;
  anon_union_8_8_cb74652f_for_val aVar3;
  vm_datatype_t *pvVar4;
  undefined4 uVar5;
  vm_val_t *pvVar6;
  int iVar7;
  vm_obj_id_t vVar8;
  uint uVar9;
  uint16_t tmp;
  
  if (getp_get_unique(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar7 = __cxa_guard_acquire(&getp_get_unique(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    if (iVar7 != 0) {
      getp_get_unique::desc.min_argc_ = 0;
      getp_get_unique::desc.opt_argc_ = 0;
      getp_get_unique::desc.varargs_ = 0;
      __cxa_guard_release(&getp_get_unique(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar7 = CVmObject::get_prop_check_argc(retval,argc,&getp_get_unique::desc);
  pvVar6 = sp_;
  if (iVar7 == 0) {
    pvVar4 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar4 = VM_OBJ;
    (pvVar6->val).obj = self;
    uVar1 = *(ushort *)((this->super_CVmObjCollection).super_CVmObject.ext_ + 2);
    vVar8 = create(0,(ulong)uVar1);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar8;
    pvVar6 = sp_;
    uVar5 = *(undefined4 *)&retval->field_0x4;
    aVar3 = retval->val;
    sp_ = sp_ + 1;
    pvVar6->typ = retval->typ;
    *(undefined4 *)&pvVar6->field_0x4 = uVar5;
    pvVar6->val = aVar3;
    pCVar2 = G_obj_table_X.pages_[(retval->val).obj >> 0xc];
    uVar9 = (retval->val).obj & 0xfff;
    *(ushort *)(*(long *)((long)&pCVar2[uVar9].ptr_ + 8) + 2) = uVar1;
    memcpy((void *)(*(long *)((long)&pCVar2[uVar9].ptr_ + 8) + 4),
           (this->super_CVmObjCollection).super_CVmObject.ext_ + 4,(ulong)uVar1 * 5);
    cons_uniquify((CVmObjVector *)(pCVar2 + uVar9));
    sp_ = sp_ + -2;
  }
  return 1;
}

Assistant:

int CVmObjVector::getp_get_unique(VMG_ vm_obj_id_t self, vm_val_t *retval,
                                  uint *argc)
{
    CVmObjVector *new_vec;
    size_t cnt;
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* put myself on the stack for GC protection */
    G_interpreter->push_obj(vmg_ self);

    /* 
     *   allocate a new vector for the return value - the new vector will
     *   never be any larger than the original 
     */
    cnt = get_element_count();
    retval->set_obj(create(vmg_ FALSE, cnt));

    /* push a reference to the new list for gc protection */
    G_stk->push(retval);

    /* get the return value as a vector */
    new_vec = (CVmObjVector *)vm_objp(vmg_ retval->val.obj);

    /* start out with the result element count the same as my own */
    new_vec->set_element_count(cnt);

    /* copy my elements to the new vector */
    memcpy(new_vec->get_element_ptr(0), get_element_ptr(0),
           calc_alloc_ele(cnt));

    /* uniquify the result */
    new_vec->cons_uniquify(vmg0_);

    /* discard the gc protection */
    G_stk->discard(2);

    /* handled */
    return TRUE;
}